

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O3

void __thiscall OutputBox::OutputBox(OutputBox *this,string *title,uint bar_width,uint pre_spaces)

{
  string *data;
  int iVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  data = &this->title_;
  (this->title_)._M_dataplus._M_p = (pointer)&(this->title_).field_2;
  (this->title_)._M_string_length = 0;
  (this->title_).field_2._M_local_buf[0] = '\0';
  (this->pb).post_message_._M_dataplus._M_p = (pointer)&(this->pb).post_message_.field_2;
  (this->pb).post_message_._M_string_length = 0;
  (this->pb).post_message_.field_2._M_local_buf[0] = '\0';
  (this->pb).pre_message_._M_dataplus._M_p = (pointer)&(this->pb).pre_message_.field_2;
  (this->pb).pre_message_._M_string_length = 0;
  (this->pb).pre_message_.field_2._M_local_buf[0] = '\0';
  (this->pb).cur_test_ = 1;
  this->pre_spaces_ = pre_spaces;
  uVar3 = 0x50;
  if (bar_width < 0x50) {
    uVar3 = bar_width;
  }
  this->bar_width_ = uVar3 - pre_spaces;
  if ((ulong)((uVar3 - pre_spaces) - 4) < title->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)title);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar2[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar2;
    }
    local_40 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)data,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)data);
  }
  iVar1 = std::__cxx11::string::compare((char *)data);
  if (iVar1 != 0) {
    StreamDemultiplexer::operator<<((StreamDemultiplexer *)&dmux::cout,(char (*) [2])0x32a160);
    PrintSeparatorLine(this);
    PrintData(this,data);
    PrintSeparatorLine(this);
  }
  return;
}

Assistant:

OutputBox(const std::string& title = "", 
        const unsigned bar_width = CONSOLE_WIDTH, 
        const unsigned pre_spaces = 2)
    {
        pre_spaces_ = pre_spaces;
        bar_width_ = bar_width > CONSOLE_WIDTH ? CONSOLE_WIDTH : bar_width;
        bar_width_ -= pre_spaces_;

        if (title.size() > bar_width_ - 4) {
            title_ = title.substr(0, bar_width_ - 4 - 3) + "...";
        }
        else {
            title_ = title;
        }
        //transform(title_.begin(), title_.end(), title_.begin(), ::toupper);

        if (title_ != "") {
            dmux::cout << "\n";
            PrintSeparatorLine();
            PrintData(title_);
            PrintSeparatorLine();
        }
    }